

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_hdr(char *filename)

{
  FILE *__stream;
  int result;
  FILE *f;
  FILE *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar1;
  char *in_stack_fffffffffffffff0;
  
  __stream = (FILE *)stbi__fopen(in_stack_fffffffffffffff0,
                                 (char *)CONCAT44(in_stack_ffffffffffffffec,
                                                  in_stack_ffffffffffffffe8));
  iVar1 = 0;
  if (__stream != (FILE *)0x0) {
    iVar1 = stbi_is_hdr_from_file(in_stack_000000c0);
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

STBIDEF int      stbi_is_hdr          (char const *filename)
{
   FILE *f = stbi__fopen(filename, "rb");
   int result=0;
   if (f) {
      result = stbi_is_hdr_from_file(f);
      fclose(f);
   }
   return result;
}